

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O1

void __thiscall UnitTest_table1::UnitTest_table1(UnitTest_table1 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_001886c8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x169560);
  return;
}

Assistant:

TEST_CASE(table1)
{
    luna::Table t;

    for (int i = 0; i < 3; ++i)
    {
        luna::Value value;
        value.num_ = i + 1;
        value.type_ = luna::ValueT_Number;
        EXPECT_TRUE(t.SetArrayValue(i + 1, value));
    }

    luna::Value key;
    luna::Value value;
    EXPECT_TRUE(t.FirstKeyValue(key, value));
    EXPECT_TRUE(key.type_ == luna::ValueT_Number);
    EXPECT_TRUE(key.num_ == static_cast<double>(1));
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == static_cast<double>(1));

    for (int i = 1; i < 3; ++i)
    {
        luna::Value next_key;
        luna::Value next_value;
        EXPECT_TRUE(t.NextKeyValue(key, next_key, next_value));
        EXPECT_TRUE(next_key.type_ == luna::ValueT_Number);
        EXPECT_TRUE(next_key.num_ == static_cast<double>(i + 1));
        EXPECT_TRUE(next_value.type_ == luna::ValueT_Number);
        EXPECT_TRUE(next_value.num_ == static_cast<double>(i + 1));
        key = next_key;
    }

    EXPECT_TRUE(!t.NextKeyValue(key, key, value));

    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == static_cast<double>(3));
}